

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O0

bool __thiscall
cmCTestVC::RunChild(cmCTestVC *this,char **cmd,OutputParser *out,OutputParser *err,char *workDir,
                   Encoding encoding)

{
  int iVar1;
  ostream *poVar2;
  cmsysProcess *cp_00;
  char *local_a0;
  int result;
  cmsysProcess *cp;
  string local_58;
  Encoding local_34;
  char *pcStack_30;
  Encoding encoding_local;
  char *workDir_local;
  OutputParser *err_local;
  OutputParser *out_local;
  char **cmd_local;
  cmCTestVC *this_local;
  
  poVar2 = this->Log;
  local_34 = encoding;
  pcStack_30 = workDir;
  workDir_local = (char *)err;
  err_local = out;
  out_local = (OutputParser *)cmd;
  cmd_local = (char **)this;
  ComputeCommandLine_abi_cxx11_(&local_58,(cmCTestVC *)cmd,(char **)out);
  poVar2 = std::operator<<(poVar2,(string *)&local_58);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_58);
  cp_00 = cmsysProcess_New();
  cmsysProcess_SetCommand(cp_00,(char **)out_local);
  if (pcStack_30 == (char *)0x0) {
    local_a0 = (char *)std::__cxx11::string::c_str();
  }
  else {
    local_a0 = pcStack_30;
  }
  pcStack_30 = local_a0;
  cmsysProcess_SetWorkingDirectory(cp_00,local_a0);
  cmProcessTools::RunProcess(cp_00,err_local,(OutputParser *)workDir_local,local_34);
  iVar1 = cmsysProcess_GetExitValue(cp_00);
  cmsysProcess_Delete(cp_00);
  return iVar1 == 0;
}

Assistant:

bool cmCTestVC::RunChild(char const* const* cmd, OutputParser* out,
                         OutputParser* err, const char* workDir,
                         Encoding encoding)
{
  this->Log << this->ComputeCommandLine(cmd) << "\n";

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, cmd);
  workDir = workDir ? workDir : this->SourceDirectory.c_str();
  cmsysProcess_SetWorkingDirectory(cp, workDir);
  this->RunProcess(cp, out, err, encoding);
  int result = cmsysProcess_GetExitValue(cp);
  cmsysProcess_Delete(cp);
  return result == 0;
}